

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O3

void ncnn::conv3x3s1_winograd43_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  int *piVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  void *pvVar24;
  int iVar25;
  int iVar26;
  void *pvVar27;
  long lVar28;
  uint uVar29;
  void *pvVar30;
  Option *opt_00;
  long lVar31;
  ulong uVar32;
  float *pfVar33;
  long lVar34;
  float *pfVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  float *pfVar41;
  void *pvVar42;
  void *pvVar43;
  Mat *dst;
  void *pvVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  void *local_348;
  void *local_340;
  void *local_338;
  void *local_330;
  void *local_328;
  void *local_320;
  void *local_318;
  void *local_310;
  void *local_308;
  long local_300;
  void *local_2f8;
  void *local_2f0;
  float *local_2e8;
  long local_2e0;
  void *local_2d8;
  void *local_2d0;
  undefined1 local_2c8 [16];
  Mat local_288;
  Mat *local_238;
  Option *local_230;
  Mat local_228;
  undefined1 local_1d8 [16];
  undefined8 local_1c0;
  ulong local_1b8;
  Mat *local_1b0;
  undefined1 local_1a8 [60];
  float fStack_16c;
  undefined8 local_168;
  float afStack_160 [8];
  float afStack_140 [6];
  float afStack_128 [6];
  float afStack_110 [6];
  float afStack_f8 [6];
  float afStack_e0 [6];
  undefined1 local_c8 [64];
  size_t local_88;
  Option opt_b;
  
  iVar25 = bottom_blob->c;
  uVar5 = top_blob->w;
  uVar7 = top_blob->h;
  auVar45._4_4_ = uVar7;
  auVar45._0_4_ = uVar5;
  iVar9 = top_blob->c;
  piVar10 = bottom_blob->refcount;
  local_228.data = bottom_blob->data;
  local_228.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_228.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_228.elemsize = bottom_blob->elemsize;
  local_228.elempack = bottom_blob->elempack;
  local_228.allocator = bottom_blob->allocator;
  iVar21 = bottom_blob->h;
  iVar26 = bottom_blob->w;
  uVar13 = bottom_blob->dims;
  uVar14 = bottom_blob->w;
  uVar15 = bottom_blob->h;
  uVar16 = bottom_blob->d;
  local_228.cstep = bottom_blob->cstep;
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + 1;
    UNLOCK();
    iVar26 = bottom_blob->w;
    iVar21 = bottom_blob->h;
  }
  auVar47._8_4_ = 3;
  auVar47._0_8_ = 0x300000003;
  auVar47._12_4_ = 3;
  auVar45._8_8_ = 0;
  auVar45 = vpaddd_avx(auVar45,auVar47);
  auVar48 = vpsrad_avx(auVar45,0x1f);
  auVar48 = vpsrld_avx(auVar48,0x1e);
  local_2c8 = vpaddd_avx(auVar45,auVar48);
  auVar48._8_4_ = 0xfffffffc;
  auVar48._0_8_ = 0xfffffffcfffffffc;
  auVar48._12_4_ = 0xfffffffc;
  local_1d8 = vpand_avx(local_2c8,auVar48);
  local_1b8 = (ulong)local_1d8._4_4_;
  local_1c0 = CONCAT44((int)(local_228.cstep >> 0x20),local_1d8._0_4_);
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.openmp_blocktime = opt->openmp_blocktime;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_bf16_storage = opt->use_bf16_storage;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_packed = opt->use_int8_packed;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b.use_shader_pack8 = opt->use_shader_pack8;
  opt_b.use_subgroup_basic = opt->use_subgroup_basic;
  opt_b.use_subgroup_vote = opt->use_subgroup_vote;
  opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt_b.use_image_storage = opt->use_image_storage;
  opt_b.use_tensor_storage = opt->use_tensor_storage;
  opt_b.use_reserved_0 = opt->use_reserved_0;
  opt_b.flush_denormals = opt->flush_denormals;
  opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt_b.use_shader_local_memory = opt->use_shader_local_memory;
  opt_b.use_cooperative_matrix = opt->use_cooperative_matrix;
  opt_b.use_winograd23_convolution = opt->use_winograd23_convolution;
  opt_b.use_winograd43_convolution = opt->use_winograd43_convolution;
  opt_b.use_winograd63_convolution = opt->use_winograd63_convolution;
  opt_b.use_reserved_6 = opt->use_reserved_6;
  opt_b.use_reserved_7 = opt->use_reserved_7;
  opt_b.use_reserved_8 = opt->use_reserved_8;
  opt_b.use_reserved_9 = opt->use_reserved_9;
  opt_b.use_reserved_10 = opt->use_reserved_10;
  opt_b.use_reserved_11 = opt->use_reserved_11;
  opt_b.blob_allocator = opt->workspace_allocator;
  auVar48 = opt_b._32_16_;
  local_228.dims = uVar13;
  local_228.w = uVar14;
  local_228.h = uVar15;
  local_228.d = uVar16;
  local_228.c = iVar25;
  local_1b0 = bias;
  copy_make_border(bottom_blob,&local_228,0,(local_1d8._4_4_ + 2) - iVar21,0,
                   (local_1d8._0_4_ + 2) - iVar26,0,0.0,&opt_b);
  auVar45 = vpsrad_avx(local_2c8,2);
  local_168 = 0;
  local_1a8._0_8_ = (void *)0x0;
  local_1a8._8_4_ = 0;
  local_1a8._12_4_ = 0;
  local_1a8._16_8_ = 0;
  local_1a8._24_4_ = 0;
  local_1a8._32_8_ = (Allocator *)0x0;
  local_1a8._40_4_ = 0;
  local_1a8._44_4_ = 0;
  local_1a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_238 = top_blob;
  local_230 = opt;
  Mat::create((Mat *)local_1a8,auVar45._4_4_ * auVar45._0_4_,0x24,iVar25,4,opt->workspace_allocator)
  ;
  opt_00 = local_230;
  dst = local_238;
  if (0 < (long)local_228.c) {
    iVar25 = local_228.h + 1;
    if (-1 < local_228.h + -2) {
      iVar25 = local_228.h + -2;
    }
    uVar22 = iVar25 >> 2;
    iVar25 = local_228.w + 1;
    if (-1 < local_228.w + -2) {
      iVar25 = local_228.w + -2;
    }
    uVar29 = iVar25 >> 2;
    iVar25 = uVar29 * uVar22;
    uVar36 = 1;
    if (1 < (int)uVar29) {
      uVar36 = (ulong)uVar29;
    }
    uVar38 = 1;
    if (1 < (int)uVar22) {
      uVar38 = (ulong)uVar22;
    }
    local_2e8 = (float *)((long)local_228.data + 0x14);
    lVar23 = local_1a8._16_8_ * local_168;
    lVar40 = (long)(int)uVar29 * 4;
    local_328 = (void *)(local_1a8._0_8_ + (long)iVar25 * 4);
    local_330 = (void *)(local_1a8._0_8_ + (long)(iVar25 * 2) * 4);
    local_338 = (void *)(local_1a8._0_8_ + (long)(iVar25 * 3) * 4);
    local_340 = (void *)(local_1a8._0_8_ + (long)(iVar25 * 4) * 4);
    local_2f0 = (void *)local_1a8._0_8_;
    local_348 = (void *)(local_1a8._0_8_ + (long)(iVar25 * 5) * 4);
    auVar48 = SUB6416(ZEXT464(0xc0a00000),0);
    lVar28 = 0;
    do {
      if (5 < local_228.h) {
        local_2c8._0_8_ = local_348;
        local_2d0 = local_340;
        local_308 = local_338;
        local_310 = local_330;
        local_318 = local_328;
        local_320 = local_2f0;
        uVar32 = 0;
        pfVar35 = local_2e8;
        do {
          if (5 < local_228.w) {
            uVar37 = 0;
            pvVar24 = local_308;
            pvVar27 = local_2d0;
            pvVar30 = local_320;
            lVar39 = local_2c8._0_8_;
            pfVar41 = pfVar35;
            pvVar42 = local_318;
            pvVar44 = local_310;
            do {
              lVar31 = -0x18;
              pfVar33 = pfVar41;
              do {
                fVar49 = pfVar33[-4];
                fVar1 = pfVar33[-3];
                fVar2 = pfVar33[-2];
                fVar3 = pfVar33[-1];
                fVar11 = (fVar49 - fVar2) + (fVar49 - fVar2);
                fVar4 = *pfVar33;
                *(float *)((long)afStack_140 + lVar31) = fVar1 * -5.0 + fVar3 + pfVar33[-5] * 4.0;
                *(float *)((long)afStack_128 + lVar31) = fVar3 + fVar2 + (fVar1 + fVar49) * -4.0;
                *(float *)((long)afStack_110 + lVar31) = (fVar3 - fVar2) + (fVar49 - fVar1) * 4.0;
                *(float *)((long)afStack_f8 + lVar31) = (fVar3 - fVar1) - fVar11;
                *(float *)((long)afStack_e0 + lVar31) = fVar11 + (fVar3 - fVar1);
                *(float *)(local_c8 + lVar31) = fVar2 * -5.0 + fVar49 * 4.0 + fVar4;
                pfVar33 = pfVar33 + local_228.w;
                lVar31 = lVar31 + 4;
              } while (lVar31 != 0);
              lVar31 = 0x14;
              lVar34 = 0;
              do {
                fVar49 = *(float *)((long)afStack_160 + lVar31 + -8);
                fVar1 = *(float *)((long)afStack_160 + lVar31 + -4);
                fVar2 = *(float *)((long)afStack_160 + lVar31);
                fVar3 = *(float *)((long)afStack_160 + lVar31 + 4);
                fVar11 = (fVar49 - fVar2) + (fVar49 - fVar2);
                fVar4 = *(float *)((long)afStack_160 + lVar31 + 8);
                *(float *)((long)pvVar30 + lVar34) =
                     fVar1 * -5.0 + fVar3 + *(float *)((long)&fStack_16c + lVar31) * 4.0;
                *(float *)((long)pvVar42 + lVar34) = fVar3 + fVar2 + (fVar1 + fVar49) * -4.0;
                *(float *)((long)pvVar44 + lVar34) = (fVar3 - fVar2) + (fVar49 - fVar1) * 4.0;
                *(float *)((long)pvVar24 + lVar34) = (fVar3 - fVar1) - fVar11;
                *(float *)((long)pvVar27 + lVar34) = fVar11 + (fVar3 - fVar1);
                *(float *)(lVar39 + lVar34) = fVar2 * -5.0 + fVar49 * 4.0 + fVar4;
                lVar31 = lVar31 + 0x18;
                lVar34 = lVar34 + (long)(iVar25 * 6) * 4;
              } while (lVar31 != 0xa4);
              uVar37 = uVar37 + 1;
              pfVar41 = pfVar41 + 4;
              pvVar30 = (void *)((long)pvVar30 + 4);
              pvVar42 = (void *)((long)pvVar42 + 4);
              pvVar44 = (void *)((long)pvVar44 + 4);
              pvVar24 = (void *)((long)pvVar24 + 4);
              pvVar27 = (void *)((long)pvVar27 + 4);
              lVar39 = lVar39 + 4;
            } while (uVar37 != uVar36);
          }
          uVar32 = uVar32 + 1;
          pfVar35 = pfVar35 + local_228.elemsize * (long)local_228.w;
          local_320 = (void *)((long)local_320 + lVar40);
          local_318 = (void *)((long)local_318 + lVar40);
          local_310 = (void *)((long)local_310 + lVar40);
          local_308 = (void *)((long)local_308 + lVar40);
          local_2d0 = (void *)((long)local_2d0 + lVar40);
          local_2c8._0_8_ = local_2c8._0_8_ + lVar40;
        } while (uVar32 != uVar38);
      }
      lVar28 = lVar28 + 1;
      local_2e8 = (float *)((long)local_2e8 + local_228.cstep * local_228.elemsize);
      local_2f0 = (void *)((long)local_2f0 + lVar23);
      local_328 = (void *)((long)local_328 + lVar23);
      local_330 = (void *)((long)local_330 + lVar23);
      local_338 = (void *)((long)local_338 + lVar23);
      local_340 = (void *)((long)local_340 + lVar23);
      local_348 = (void *)((long)local_348 + lVar23);
    } while (lVar28 != local_228.c);
  }
  piVar10 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        if (local_228.data != (void *)0x0) {
          free(local_228.data);
        }
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_228.cstep = 0;
  local_228.data = (void *)0x0;
  local_228.refcount._0_4_ = 0;
  local_228.refcount._4_4_ = 0;
  local_228.elemsize = 0;
  local_228.elempack = 0;
  local_228.h = 0;
  local_228.d = 0;
  local_228.c = 0;
  local_228.allocator = (Allocator *)0x0;
  local_228.dims = 0;
  local_228.w = 0;
  local_88 = 0;
  local_c8._0_8_ = (void *)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_8_ = 0;
  local_c8._24_4_ = 0;
  local_c8._32_8_ = (Allocator *)0x0;
  local_c8._40_4_ = 0;
  local_c8._44_4_ = 0;
  local_c8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  convolution_winograd_dot_sse((Mat *)local_1a8,iVar9,kernel_tm,(Mat *)local_c8,opt_00);
  local_288.cstep = 0;
  local_288.data = (void *)0x0;
  local_288.refcount._0_4_ = 0;
  local_288.refcount._4_4_ = 0;
  local_288.elemsize = 0;
  local_288.elempack = 0;
  local_288.allocator = (Allocator *)0x0;
  local_288.dims = 0;
  local_288.w = 0;
  local_288.h = 0;
  local_288.d = 0;
  local_288.c = 0;
  uVar6 = dst->w;
  uVar8 = dst->h;
  auVar46._4_4_ = uVar8;
  auVar46._0_4_ = uVar6;
  auVar46._8_8_ = 0;
  auVar45 = vpcmpeqd_avx(auVar46,local_1d8);
  auVar47 = vpmovsxdq_avx(auVar45);
  auVar45 = vpcmpeqd_avx(auVar48,auVar48);
  if (((auVar45 & ~auVar47) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
      -1 < SUB161(auVar45 & ~auVar47,0xf)) {
    if (&local_288 == dst) {
      iVar25 = 0;
      iVar9 = 0;
      goto LAB_0025c276;
    }
    piVar10 = dst->refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    local_288.data = dst->data;
    local_288.refcount._0_4_ = SUB84(dst->refcount,0);
    local_288.refcount._4_4_ = (undefined4)((ulong)dst->refcount >> 0x20);
    local_288.elemsize = dst->elemsize;
    local_288.elempack = dst->elempack;
    local_288.allocator = dst->allocator;
    uVar17 = dst->dims;
    uVar18 = dst->w;
    uVar19 = dst->h;
    uVar20 = dst->d;
    local_288.c = dst->c;
    local_288.cstep = dst->cstep;
    local_288.dims = uVar17;
    local_288.w = uVar18;
    local_288.h = uVar19;
    local_288.d = uVar20;
    iVar25 = dst->h;
    iVar9 = dst->w;
  }
  else {
    Mat::create(&local_288,(int)local_1c0,(int)local_1b8,iVar9,4,opt_00->workspace_allocator);
    iVar25 = local_288.h;
    iVar9 = local_288.w;
  }
  if (0 < local_288.c) {
    iVar21 = iVar25 + 3;
    if (-1 < iVar25) {
      iVar21 = iVar25;
    }
    pvVar24 = local_1b0->data;
    iVar26 = iVar9 + 3;
    if (-1 < iVar9) {
      iVar26 = iVar9;
    }
    uVar22 = iVar26 >> 2;
    iVar26 = uVar22 * (iVar21 >> 2);
    lVar28 = local_c8._16_8_ * local_88;
    local_330 = (void *)(local_c8._0_8_ + (long)iVar26 * 4);
    local_338 = (void *)(local_c8._0_8_ + (long)(iVar26 * 2) * 4);
    local_340 = (void *)(local_c8._0_8_ + (long)(iVar26 * 3) * 4);
    local_348 = (void *)(local_c8._0_8_ + (long)(iVar26 * 4) * 4);
    local_2f8 = (void *)(local_c8._0_8_ + (long)(iVar26 * 5) * 4);
    local_328 = (void *)((long)local_288.data + 0xc);
    local_1d8._0_8_ = local_288.cstep * local_288.elemsize;
    lVar23 = (ulong)uVar22 * 4;
    local_300 = 0;
    uVar36 = 0;
    do {
      if (pvVar24 == (void *)0x0) {
        fVar49 = 0.0;
      }
      else {
        fVar49 = *(float *)((long)pvVar24 + uVar36 * 4);
      }
      if (3 < iVar25) {
        local_2c8._0_8_ = local_328;
        local_308 = local_2f8;
        local_310 = local_348;
        local_318 = local_340;
        local_320 = local_338;
        local_2d8 = local_330;
        local_2e0 = local_300;
        uVar38 = 0;
        do {
          if (3 < iVar9) {
            uVar32 = 0;
            pvVar27 = local_318;
            pvVar30 = local_320;
            pvVar42 = local_2d8;
            pfVar35 = (float *)local_2c8._0_8_;
            lVar40 = local_2e0;
            pvVar44 = local_308;
            pvVar43 = local_310;
            do {
              lVar31 = -0x18;
              lVar39 = 0;
              do {
                fVar1 = *(float *)((long)pvVar42 + lVar39 * 4);
                fVar2 = *(float *)((long)pvVar30 + lVar39 * 4);
                fVar3 = *(float *)((long)pvVar27 + lVar39 * 4);
                fVar4 = *(float *)((long)pvVar43 + lVar39 * 4);
                fVar11 = fVar2 + fVar1;
                fVar1 = fVar1 - fVar2;
                fVar12 = fVar4 + fVar3;
                fVar3 = fVar3 - fVar4;
                fVar2 = *(float *)((long)pvVar44 + lVar39 * 4);
                *(float *)((long)afStack_140 + lVar31) =
                     fVar11 + *(float *)(local_c8._0_8_ + lVar39 * 4 + lVar40) + fVar12;
                *(float *)((long)afStack_128 + lVar31) = fVar3 + fVar3 + fVar1;
                *(float *)((long)afStack_110 + lVar31) = fVar12 * 4.0 + fVar11;
                *(float *)((long)afStack_f8 + lVar31) = fVar1 + fVar2 + fVar3 * 8.0;
                lVar39 = lVar39 + iVar26 * 6;
                lVar31 = lVar31 + 4;
              } while (lVar31 != 0);
              lVar39 = 0x14;
              pfVar41 = pfVar35;
              do {
                fVar1 = *(float *)((long)afStack_160 + lVar39 + -8);
                fVar2 = *(float *)((long)afStack_160 + lVar39 + -4);
                fVar3 = *(float *)((long)afStack_160 + lVar39 + 4);
                fVar4 = fVar3 + *(float *)((long)afStack_160 + lVar39);
                fVar3 = *(float *)((long)afStack_160 + lVar39) - fVar3;
                fVar11 = fVar1 + fVar49 + fVar2;
                fVar2 = (fVar1 - fVar2) + fVar49;
                fVar1 = *(float *)((long)afStack_160 + lVar39 + 8);
                pfVar41[-3] = fVar4 + fVar11 + *(float *)((long)&fStack_16c + lVar39);
                pfVar41[-2] = fVar3 + fVar3 + fVar2;
                pfVar41[-1] = fVar4 * 4.0 + fVar11;
                *pfVar41 = fVar2 + fVar1 + fVar3 * 8.0;
                lVar39 = lVar39 + 0x18;
                pfVar41 = pfVar41 + iVar9;
              } while (lVar39 != 0x74);
              uVar32 = uVar32 + 1;
              lVar40 = lVar40 + 4;
              pvVar42 = (void *)((long)pvVar42 + 4);
              pvVar30 = (void *)((long)pvVar30 + 4);
              pvVar27 = (void *)((long)pvVar27 + 4);
              pvVar43 = (void *)((long)pvVar43 + 4);
              pvVar44 = (void *)((long)pvVar44 + 4);
              pfVar35 = pfVar35 + 4;
            } while (uVar32 != uVar22);
          }
          uVar38 = uVar38 + 1;
          local_2e0 = local_2e0 + lVar23;
          local_2d8 = (void *)((long)local_2d8 + lVar23);
          local_320 = (void *)((long)local_320 + lVar23);
          local_318 = (void *)((long)local_318 + lVar23);
          local_310 = (void *)((long)local_310 + lVar23);
          local_308 = (void *)((long)local_308 + lVar23);
          local_2c8._0_8_ = (float *)(local_2c8._0_8_ + local_288.elemsize * (long)iVar9 * 4);
        } while (uVar38 != (uint)(iVar21 >> 2));
      }
      uVar36 = uVar36 + 1;
      local_300 = local_300 + lVar28;
      local_330 = (void *)((long)local_330 + lVar28);
      local_338 = (void *)((long)local_338 + lVar28);
      local_340 = (void *)((long)local_340 + lVar28);
      local_348 = (void *)((long)local_348 + lVar28);
      local_2f8 = (void *)((long)local_2f8 + lVar28);
      local_328 = (void *)((long)local_328 + local_288.cstep * local_288.elemsize);
      opt_00 = local_230;
      dst = local_238;
    } while (uVar36 != (uint)local_288.c);
  }
LAB_0025c276:
  copy_cut_border(&local_288,dst,0,iVar25 - dst->h,0,iVar9 - dst->w,opt_00);
  piVar10 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_288.allocator == (Allocator *)0x0) {
        if (local_288.data != (void *)0x0) {
          free(local_288.data);
        }
      }
      else {
        (*(local_288.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar10 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_c8._0_8_ != (void *)0x0) {
          free((void *)local_c8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_c8._32_8_)[3])();
      }
    }
  }
  piVar10 = (int *)CONCAT44(local_1a8._12_4_,local_1a8._8_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if ((Allocator *)local_1a8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_1a8._0_8_ != (void *)0x0) {
          free((void *)local_1a8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_1a8._32_8_)[3])();
      }
    }
  }
  piVar10 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_228.allocator == (Allocator *)0x0) {
        if (local_228.data != (void *)0x0) {
          free(local_228.data);
        }
      }
      else {
        (*(local_228.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2, winograd F(4,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;

    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 4;
        int h_tiles = outh / 4;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 36, inch, 4u, opt.workspace_allocator);
        conv3x3s1_winograd43_transform_input_sse(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_sse(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd43_transform_output_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}